

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.h
# Opt level: O3

div_t __thiscall cali::Variant::div(Variant *this,int __numer,int __denom)

{
  char cVar1;
  div_t dVar2;
  div_t dVar3;
  div_t dVar4;
  div_t dVar5;
  
  cVar1 = (char)(this->m_v).type_and_size;
  if (cVar1 == '\x02') {
    dVar4.quot = 2;
    dVar4.rem = 0;
    return dVar4;
  }
  if (cVar1 != '\x03') {
    if (cVar1 == '\x06') {
      dVar2.quot = 6;
      dVar2.rem = 0;
      return dVar2;
    }
    dVar5.quot = 0;
    dVar5.rem = 0;
    return dVar5;
  }
  dVar3.quot = 3;
  dVar3.rem = 0;
  return dVar3;
}

Assistant:

cali_attr_type type() const { return cali_variant_get_type(m_v); }